

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.hpp
# Opt level: O1

void __thiscall
Utility::TypeRecipient<Electron::CharacterMapper>::typer_reset
          (TypeRecipient<Electron::CharacterMapper> *this,Typer *param_1)

{
  unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_> *this_00;
  Typer *pTVar1;
  Typer *__ptr;
  _Head_base<0UL,_Utility::Typer_*,_false> __ptr_00;
  
  (*(this->super_Delegate).super_KeyActions._vptr_KeyActions[1])();
  this_00 = &this->typer_;
  pTVar1 = (this->typer_)._M_t.
           super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
           super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
           super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  __ptr = (this->previous_typer_)._M_t.
          super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
          super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
          super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  (this->typer_)._M_t.super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>.
  _M_t.super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->previous_typer_)._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = pTVar1;
  if (__ptr != (Typer *)0x0) {
    std::default_delete<Utility::Typer>::operator()
              ((default_delete<Utility::Typer> *)&this->previous_typer_,__ptr);
  }
  __ptr_00._M_head_impl =
       (this_00->_M_t).super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>.
       _M_t.super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
       super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  (this_00->_M_t).super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  if (__ptr_00._M_head_impl != (Typer *)0x0) {
    std::default_delete<Utility::Typer>::operator()
              ((default_delete<Utility::Typer> *)this_00,__ptr_00._M_head_impl);
    return;
  }
  return;
}

Assistant:

void typer_reset(Typer *) override {
			clear_all_keys();

			// It's unsafe to deallocate typer right now, since it is the caller, but also it has a small
			// memory footprint and it's desireable not to imply that the subclass need call it any more.
			// So shuffle it off into a siding.
			previous_typer_ = std::move(typer_);
			typer_ = nullptr;
		}